

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O2

string * __thiscall
onmt::Tokenizer::detokenize_abi_cxx11_
          (string *__return_storage_ptr__,Tokenizer *this,
          vector<onmt::Token,_std::allocator<onmt::Token>_> *tokens,Ranges *ranges,bool merge_ranges
          ,vector<unsigned_long,_std::allocator<unsigned_long>_> *index_map)

{
  pointer pTVar1;
  pointer puVar2;
  bool bVar3;
  uint uVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  ulong uVar6;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>
  _Var7;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>
  __x;
  int width;
  code_point_t uc;
  iterator __begin2;
  pointer puVar8;
  undefined7 in_register_00000081;
  Token *this_00;
  int end;
  int start;
  string *local_1d8;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
  *local_1d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> current_token;
  tuple<int_&,_int_&> local_1a8;
  Tokenizer *local_198;
  _Head_base<0UL,_unsigned_long_&,_false> local_190;
  size_t id;
  undefined4 local_17c;
  string prep_word;
  string bridge;
  string c;
  string code;
  
  local_17c = (undefined4)CONCAT71(in_register_00000081,merge_ranges);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_1d8 = __return_storage_ptr__;
  local_1d0 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
               *)ranges;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_198 = this;
  for (current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar1 = (tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
               super__Vector_impl_data._M_start,
      current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start <
      (pointer)(((long)(tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x48);
      current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)current_token.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + 1)) {
    this_00 = pTVar1 + (long)current_token.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
    if ((((current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start != (pointer)0x0) &&
         ((local_198->_options).with_separators == false)) && (this_00[-1].join_right == false)) &&
       (this_00->join_left == false)) {
      std::__cxx11::string::push_back((char)local_1d8);
    }
    std::__cxx11::string::string((string *)&prep_word,(string *)this_00);
    bVar3 = Token::is_placeholder(this_00);
    if (!bVar3) {
      if (Lowercase < this_00->casing) {
        restore_token_casing(&code,&prep_word,this_00->casing,&(this->_options).lang);
        std::__cxx11::string::operator=((string *)&prep_word,(string *)&code);
        std::__cxx11::string::~string((string *)&code);
      }
      while ((uVar6 = std::__cxx11::string::find
                                ((string *)&prep_word,(ulong)&escaped_character_prefix_abi_cxx11_),
             uVar6 != 0xffffffffffffffff && (uVar6 + DAT_003c0870 + 4 <= prep_word._M_string_length)
             )) {
        width = 4;
        std::__cxx11::string::substr((ulong)&code,(ulong)&prep_word);
        uVar4 = hex_to_int(&code);
        unicode::cp_to_utf8_abi_cxx11_(&c,(unicode *)(ulong)uVar4,uc);
        if ((CONCAT44(c._M_string_length._4_4_,(undefined4)c._M_string_length) != 0) &&
           (*c._M_dataplus._M_p != '\0')) {
          int_to_hex_abi_cxx11_(&bridge,(onmt *)(ulong)uVar4,4,width);
          bVar3 = std::operator!=(&bridge,&code);
          std::__cxx11::string::~string((string *)&bridge);
          if (!bVar3) {
            std::__cxx11::string::replace((ulong)&prep_word,uVar6,(string *)(DAT_003c0870 + 4));
          }
        }
        std::__cxx11::string::~string((string *)&c);
        std::__cxx11::string::~string((string *)&code);
      }
    }
    if (prep_word._M_string_length != 0) {
      if (local_1d0 !=
          (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
           *)0x0) {
        pvVar5 = &current_token;
        if (index_map != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
          pvVar5 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                             (index_map,
                              (size_type)
                              current_token.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        }
        bridge._M_dataplus._M_p = (pointer)local_1d8->_M_string_length;
        local_1a8.super__Tuple_impl<0UL,_int_&,_int_&>.super__Tuple_impl<1UL,_int_&>.
        super__Head_base<1UL,_int_&,_false>._M_head_impl =
             (_Head_base<1UL,_int_&,_false>)
             (bridge._M_dataplus._M_p + (prep_word._M_string_length - 1));
        code._M_dataplus._M_p = (pointer)&local_1a8;
        code._M_string_length = (size_type)&bridge;
        c._M_dataplus._M_p = (pointer)pvVar5;
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
        ::
        _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<unsigned_long&&,unsigned_long&&>>
                  (local_1d0,(piecewise_construct_t *)&std::piecewise_construct,
                   (tuple<const_unsigned_long_&> *)&c,
                   (tuple<unsigned_long_&&,_unsigned_long_&&> *)&code);
      }
      std::__cxx11::string::append((string *)local_1d8);
    }
    std::__cxx11::string::~string((string *)&prep_word);
  }
  if (((byte)local_17c &
      local_1d0 !=
      (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
       *)0x0) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bridge,"",(allocator<char> *)&current_token);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prep_word,"",(allocator<char> *)&local_1a8);
    Tokenizer((Tokenizer *)&code,Conservative,0,&bridge,(string *)joiner_marker_abi_cxx11_,
              &prep_word,0x32);
    std::__cxx11::string::~string((string *)&prep_word);
    std::__cxx11::string::~string((string *)&bridge);
    prep_word._M_dataplus._M_p = (pointer)0x0;
    prep_word._M_string_length = 0;
    prep_word.field_2._M_allocated_capacity = 0;
    bridge._M_dataplus._M_p = (pointer)&bridge.field_2;
    bridge._M_string_length = 0;
    c.field_2._8_8_ = &c._M_string_length;
    c._M_string_length._0_4_ = 0;
    c.field_2._M_allocated_capacity = 0;
    current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    start = 0;
    end = -1;
    bridge.field_2._M_local_buf[0] = '\0';
    current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198 = (Tokenizer *)(local_1d0 + 8);
    for (__x._M_node = *(_Base_ptr *)(local_1d0 + 0x18);
        puVar2 = current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish, (Tokenizer *)__x._M_node != local_198;
        __x._M_node = (_Base_ptr)std::_Rb_tree_increment(__x._M_node)) {
      puVar8 = current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (end + 1 == *(int *)&__x._M_node[1]._M_parent) {
        if (__x._M_node != *(_Base_ptr *)(local_1d0 + 0x18)) {
          _Var7 = std::
                  prev<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
                            (__x,1);
          std::__cxx11::string::assign
                    ((string *)&bridge,(ulong)local_1d8,(ulong)_Var7._M_node[1]._M_parent);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&prep_word);
          ITokenizer::tokenize
                    ((ITokenizer *)&code,&bridge,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&prep_word,true);
          puVar8 = current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar2 = current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (0x20 < prep_word._M_string_length - (long)prep_word._M_dataplus._M_p)
          goto LAB_001f5e6e;
        }
      }
      else {
LAB_001f5e6e:
        for (; puVar8 != puVar2; puVar8 = puVar8 + 1) {
          id = *puVar8;
          local_190._M_head_impl = &id;
          local_1a8.super__Tuple_impl<0UL,_int_&,_int_&>.super__Tuple_impl<1UL,_int_&>.
          super__Head_base<1UL,_int_&,_false>._M_head_impl = (_Head_base<1UL,_int_&,_false>)&end;
          local_1a8.super__Tuple_impl<0UL,_int_&,_int_&>.super__Head_base<0UL,_int_&,_false>.
          _M_head_impl = &start;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
          ::
          _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<int&,int&>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
                      *)&c,(piecewise_construct_t *)&std::piecewise_construct,
                     (tuple<unsigned_long_&> *)&local_190,&local_1a8);
        }
        if (current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        start = *(int *)&__x._M_node[1]._M_parent;
      }
      end = *(int *)&__x._M_node[1]._M_left;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&current_token,(value_type_conflict2 *)(__x._M_node + 1));
    }
    if (current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      for (puVar8 = current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1)
      {
        id = *puVar8;
        local_190._M_head_impl = &id;
        local_1a8.super__Tuple_impl<0UL,_int_&,_int_&>.super__Tuple_impl<1UL,_int_&>.
        super__Head_base<1UL,_int_&,_false>._M_head_impl = (_Head_base<1UL,_int_&,_false>)&end;
        local_1a8.super__Tuple_impl<0UL,_int_&,_int_&>.super__Head_base<0UL,_int_&,_false>.
        _M_head_impl = &start;
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
        ::
        _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<int&,int&>>
                  ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<unsigned_long,unsigned_long>>>>
                    *)&c,(piecewise_construct_t *)&std::piecewise_construct,
                   (tuple<unsigned_long_&> *)&local_190,&local_1a8);
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&current_token.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::__cxx11::string::~string((string *)&bridge);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&prep_word);
    ~Tokenizer((Tokenizer *)&code);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::operator=((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                 *)local_1d0,
                (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                 *)&c);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                 *)&c);
  }
  return local_1d8;
}

Assistant:

std::string Tokenizer::detokenize(const std::vector<Token>& tokens,
                                    Ranges* ranges,
                                    bool merge_ranges,
                                    const std::vector<size_t>* index_map) const
  {
    std::string line;
    line.reserve(tokens.size() * 10);

    for (size_t i = 0; i < tokens.size(); ++i)
    {
      const auto& token = tokens[i];
      if (!_options.with_separators && i > 0 && !tokens[i - 1].join_right && !token.join_left)
        line += ' ';

      std::string prep_word = token.surface;

      if (!token.is_placeholder())
      {
        if (token.casing != Casing::None && token.casing != Casing::Lowercase)
          prep_word = restore_token_casing(prep_word, token.casing, _options.lang);
        unescape_characters(prep_word);
      }

      if (!prep_word.empty())
      {
        if (ranges)
          ranges->emplace(std::piecewise_construct,
                          std::forward_as_tuple(index_map ? index_map->at(i) : i),
                          std::forward_as_tuple(line.size(), line.size() + prep_word.size() - 1));

        line.append(prep_word);
      }
    }

    if (ranges && merge_ranges)
      *ranges = merge_consecutive_ranges(line, *ranges);

    return line;
  }